

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O1

Status __thiscall
flatbuffers::anon_unknown_10::DartCodeGenerator::GenerateMakeRule
          (DartCodeGenerator *this,Parser *parser,string *path,string *filename,string *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  _Rb_tree_node_base *p_Var3;
  long *plVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  included_files;
  string filebase;
  DartGenerator generator;
  string local_2d0;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  string *local_290;
  undefined1 local_288 [48];
  string local_258;
  undefined1 local_238 [128];
  undefined **local_1b8;
  Config local_1b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  StripExtension((string *)local_238,filename);
  StripPath(&local_258,(string *)local_238);
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
  }
  dart::DartGenerator::DartGenerator((DartGenerator *)local_238,parser,path,filename);
  paVar1 = &local_2d0.field_2;
  local_2d0._M_string_length = 0;
  local_2d0.field_2._M_local_buf[0] = '\0';
  local_2d0._M_dataplus._M_p = (pointer)paVar1;
  dart::DartGenerator::Filename((string *)local_288,(DartGenerator *)local_238,&local_2d0,true);
  plVar2 = (long *)std::__cxx11::string::append(local_288);
  local_2b0 = &local_2a0;
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_2a0 = *plVar4;
    lStack_298 = plVar2[3];
  }
  else {
    local_2a0 = *plVar4;
    local_2b0 = (long *)*plVar2;
  }
  local_2a8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
    operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d0._M_dataplus._M_p,
                    CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                             local_2d0.field_2._M_local_buf[0]) + 1);
  }
  local_290 = output;
  Parser::GetIncludedFilesRecursive
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_288,parser,filename);
  if ((_Rb_tree_node_base *)local_288._24_8_ != (_Rb_tree_node_base *)(local_288 + 8)) {
    p_Var3 = (_Rb_tree_node_base *)local_288._24_8_;
    do {
      std::operator+(&local_2d0," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 1));
      std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_2d0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_2d0._M_dataplus._M_p,
                        CONCAT71(local_2d0.field_2._M_allocated_capacity._1_7_,
                                 local_2d0.field_2._M_local_buf[0]) + 1);
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != (_Rb_tree_node_base *)(local_288 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_288);
  local_238._0_8_ = &PTR_generate_003f2bc8;
  local_1b8 = &PTR__Namer_003f2d00;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  Namer::Config::~Config(&local_1b0);
  BaseGenerator::~BaseGenerator((BaseGenerator *)local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::operator=((string *)local_290,(string *)&local_2b0);
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  return OK;
}

Assistant:

Status GenerateMakeRule(const Parser &parser, const std::string &path,
                          const std::string &filename,
                          std::string &output) override {
    output = DartMakeRule(parser, path, filename);
    return Status::OK;
  }